

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::namespace_uri(xml_node node)

{
  namespace_uri_predicate pred_00;
  char_t *pcVar1;
  unspecified_bool_type p_Var2;
  unspecified_bool_type p_Var3;
  xml_attribute local_38;
  xml_attribute a;
  xml_node p;
  namespace_uri_predicate pred;
  xml_node node_local;
  
  pred.prefix_length = (size_t)node._root;
  pcVar1 = xml_node::name((xml_node *)&pred.prefix_length);
  namespace_uri_predicate::namespace_uri_predicate((namespace_uri_predicate *)&p,pcVar1);
  a._attr = (xml_attribute_struct *)pred.prefix_length;
  while( true ) {
    p_Var2 = xml_node::operator_cast_to_function_pointer((xml_node *)&a);
    if (p_Var2 == (unspecified_bool_type)0x0) {
      return "";
    }
    pred_00.prefix_length = (size_t)pred.prefix;
    pred_00.prefix = (char_t *)p._root;
    local_38 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                         ((xml_node *)&a,pred_00);
    p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_38);
    if (p_Var3 != (unspecified_bool_type)0x0) break;
    a._attr = (xml_attribute_struct *)xml_node::parent((xml_node *)&a);
  }
  pcVar1 = xml_attribute::value(&local_38);
  return pcVar1;
}

Assistant:

PUGI__FN const char_t* namespace_uri(xml_node node)
	{
		namespace_uri_predicate pred = node.name();

		xml_node p = node;

		while (p)
		{
			xml_attribute a = p.find_attribute(pred);

			if (a) return a.value();

			p = p.parent();
		}

		return PUGIXML_TEXT("");
	}